

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *this;
  ArgumentListSyntax *args_1;
  NewClassExpressionSyntax *pNVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  ArgumentListSyntax *in_stack_ffffffffffffffd0;
  
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x7bb6e6);
  this = (BumpAllocator *)
         deepClone<slang::syntax::NameSyntax>
                   ((NameSyntax *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(__fn + 0x20) == 0) {
    args_1 = (ArgumentListSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::ArgumentListSyntax>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NewClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*>
                     (this,(NameSyntax *)__child_stack,(ArgumentListSyntax **)args_1);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NewClassExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NewClassExpressionSyntax>(
        *deepClone<NameSyntax>(*node.scopedNew, alloc),
        node.argList ? deepClone(*node.argList, alloc) : nullptr
    );
}